

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O3

void __thiscall wasm::ABI::wasm2js::ensureHelpers(wasm2js *this,Module *wasm,IString specific)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  Name name_08;
  Name name_09;
  Name name_10;
  Name name_11;
  Name name_12;
  Name name_13;
  Name name_14;
  Name name_15;
  Module *local_f8;
  IString specific_local;
  anon_class_16_2_b3eb4c27 ensureImport;
  Type local_d0;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  Type local_78;
  wasm2js *local_70;
  Module *wasm_local;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pcVar3 = _containsPass;
  sVar2 = SCRATCH_LOAD_I32;
  specific_local.str._M_len = specific.str._M_len;
  ensureImport.wasm = &local_f8;
  specific_local.str._M_str = (char *)&local_70;
  ppcVar1 = &specific_local.str._M_str;
  wasm_local = (Module *)0x2;
  local_f8 = wasm;
  local_70 = this;
  ::wasm::Type::Type((Type *)&ensureImport.specific,&wasm_local,1);
  name.super_IString.str._M_str = pcVar3;
  name.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name,(Type)ensureImport.specific,(Type)0x2);
  pcVar3 = SCRATCH_LOAD_F64;
  sVar2 = SCRATCH_STORE_I32;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  ::wasm::Type::Type(&local_d0,&wasm_local,2);
  name_00.super_IString.str._M_str = pcVar3;
  name_00.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_00,local_d0,(Type)0x0);
  name_01.super_IString.str._M_str = __Unwind_Resume;
  name_01.super_IString.str._M_len = SCRATCH_LOAD_F32;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_01,(Type)0x0,(Type)0x4);
  pcVar3 = std::cout;
  sVar2 = SCRATCH_STORE_F32;
  wasm_local = (Module *)0x4;
  ::wasm::Type::Type(&local_c8,&wasm_local,1);
  name_02.super_IString.str._M_str = pcVar3;
  name_02.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_02,local_c8,(Type)0x0);
  name_03.super_IString.str._M_str = cashew::OBJECT;
  name_03.super_IString.str._M_len = (size_t)SCRATCH_LOAD_F64;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_03,(Type)0x0,(Type)0x5);
  pcVar3 = UINT16ARRAY;
  sVar2 = SCRATCH_STORE_F64;
  wasm_local = (Module *)0x5;
  ::wasm::Type::Type(&local_c0,&wasm_local,1);
  name_04.super_IString.str._M_str = pcVar3;
  name_04.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_04,local_c0,(Type)0x0);
  pcVar3 = _finalize;
  sVar2 = MEMORY_INIT;
  local_58 = 2;
  uStack_50 = 2;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  ::wasm::Type::Type(&local_b8,&wasm_local,4);
  name_05.super_IString.str._M_str = pcVar3;
  name_05.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_05,local_b8,(Type)0x0);
  pcVar3 = cashew::TRSHIFT;
  sVar2 = MEMORY_FILL;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  local_58 = 2;
  ::wasm::Type::Type(&local_b0,&wasm_local,3);
  name_06.super_IString.str._M_str = pcVar3;
  name_06.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_06,local_b0,(Type)0x0);
  pcVar3 = cashew::SET;
  sVar2 = MEMORY_COPY;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  local_58 = 2;
  ::wasm::Type::Type(&local_a8,&wasm_local,3);
  name_07.super_IString.str._M_str = pcVar3;
  name_07.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_07,local_a8,(Type)0x0);
  pcVar3 = _dump;
  sVar2 = DATA_DROP;
  wasm_local = (Module *)0x2;
  ::wasm::Type::Type(&local_a0,&wasm_local,1);
  name_08.super_IString.str._M_str = pcVar3;
  name_08.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_08,local_a0,(Type)0x0);
  pcVar3 = TABLE_FILL;
  sVar2 = ATOMIC_WAIT_I32;
  local_58 = 2;
  uStack_50 = 2;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  local_48 = 2;
  ::wasm::Type::Type(&local_98,&wasm_local,5);
  name_09.super_IString.str._M_str = pcVar3;
  name_09.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_09,local_98,(Type)0x2);
  pcVar3 = _Init;
  sVar2 = ATOMIC_RMW_I64;
  local_48 = 2;
  uStack_40 = 2;
  local_58 = 2;
  uStack_50 = 2;
  wasm_local = (Module *)0x2;
  uStack_60 = 2;
  ::wasm::Type::Type(&local_90,&wasm_local,6);
  name_10.super_IString.str._M_str = pcVar3;
  name_10.super_IString.str._M_len = sVar2;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_10,local_90,(Type)0x2);
  name_11.super_IString.str._M_str = __M_construct;
  name_11.super_IString.str._M_len = GET_STASHED_BITS;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_11,(Type)0x0,(Type)0x2);
  name_12.super_IString.str._M_str = __M_create;
  name_12.super_IString.str._M_len = TRAP;
  ensureHelpers::anon_class_16_2_b3eb4c27::operator()
            ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_12,(Type)0x0,(Type)0x0);
  pcVar3 = _getStruct;
  sVar2 = TABLE_GROW;
  if (((byte)local_70[0x179] & 1) != 0) {
    wasm_local = (Module *)0x12;
    uStack_60 = 2;
    ::wasm::Type::Type(&local_88,&wasm_local,2);
    ppcVar1 = &specific_local.str._M_str;
    name_13.super_IString.str._M_str = pcVar3;
    name_13.super_IString.str._M_len = sVar2;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_13,local_88,(Type)0x0);
    pcVar4 = cashew::CALL;
    pcVar3 = TABLE_FILL;
    wasm_local = (Module *)0x2;
    uStack_60 = 0x12;
    local_58 = 2;
    ::wasm::Type::Type(&local_80,&wasm_local,3);
    name_14.super_IString.str._M_str = pcVar4;
    name_14.super_IString.str._M_len = (size_t)pcVar3;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_14,local_80,(Type)0x0);
    pcVar3 = cashew::MINUS;
    sVar2 = TABLE_COPY;
    wasm_local = (Module *)0x2;
    uStack_60 = 2;
    local_58 = 2;
    ::wasm::Type::Type(&local_78,&wasm_local,3);
    name_15.super_IString.str._M_str = pcVar3;
    name_15.super_IString.str._M_len = sVar2;
    ensureHelpers::anon_class_16_2_b3eb4c27::operator()
              ((anon_class_16_2_b3eb4c27 *)ppcVar1,name_15,local_78,(Type)0x0);
  }
  return;
}

Assistant:

inline void ensureHelpers(Module* wasm, IString specific = IString()) {
  auto ensureImport = [&](Name name, Type params, Type results) {
    if (wasm->getFunctionOrNull(name)) {
      return;
    }
    if (specific.is() && name != specific) {
      return;
    }
    auto func = Builder::makeFunction(name, Signature(params, results), {});
    func->module = ENV;
    func->base = name;
    wasm->addFunction(std::move(func));
  };

  ensureImport(SCRATCH_LOAD_I32, {Type::i32}, Type::i32);
  ensureImport(SCRATCH_STORE_I32, {Type::i32, Type::i32}, Type::none);
  ensureImport(SCRATCH_LOAD_F32, {}, Type::f32);
  ensureImport(SCRATCH_STORE_F32, {Type::f32}, Type::none);
  ensureImport(SCRATCH_LOAD_F64, {}, Type::f64);
  ensureImport(SCRATCH_STORE_F64, {Type::f64}, Type::none);
  ensureImport(
    MEMORY_INIT, {Type::i32, Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_FILL, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(MEMORY_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  ensureImport(DATA_DROP, {Type::i32}, Type::none);
  ensureImport(ATOMIC_WAIT_I32,
               {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
               Type::i32);
  ensureImport(
    ATOMIC_RMW_I64,
    {Type::i32, Type::i32, Type::i32, Type::i32, Type::i32, Type::i32},
    Type::i32);
  ensureImport(GET_STASHED_BITS, {}, Type::i32);
  ensureImport(TRAP, {}, Type::none);

  if (wasm->features.hasReferenceTypes()) {
    auto funcref = Type(HeapType::func, Nullable);
    ensureImport(TABLE_GROW, {funcref, Type::i32}, Type::none);
    ensureImport(TABLE_FILL, {Type::i32, funcref, Type::i32}, Type::none);
    ensureImport(TABLE_COPY, {Type::i32, Type::i32, Type::i32}, Type::none);
  }
}